

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.cpp
# Opt level: O0

void __thiscall cornelich::region::region(region *this,string *path,uint32_t size,int32_t index)

{
  file_mapping local_48;
  int32_t local_20;
  uint local_1c;
  int32_t index_local;
  uint32_t size_local;
  string *path_local;
  region *this_local;
  
  local_20 = index;
  local_1c = size;
  _index_local = path;
  path_local = &this->m_path;
  std::__cxx11::string::string((string *)this,(string *)path);
  this->m_index = local_20;
  this->m_size = (ulong)local_1c;
  util::create_mapping(&local_48,_index_local,local_1c);
  boost::interprocess::mapped_region::mapped_region<boost::interprocess::file_mapping>
            (&this->m_region,&local_48,read_write,0,(ulong)local_1c,(void *)0x0,-1);
  boost::interprocess::file_mapping::~file_mapping(&local_48);
  this->m_start_offset = 0;
  this->m_limit_offset = local_1c;
  std::atomic<int>::atomic(&this->m_position_offset,0);
  boost::interprocess::mapped_region::advise(&this->m_region,advice_willneed);
  return;
}

Assistant:

region::region(const std::string & path, std::uint32_t size, std::int32_t index)
    : m_path(path)
    , m_index(index)
    , m_size(size)
    , m_region(util::create_mapping(path, size), bip::read_write, 0, static_cast<std::size_t>(size), 0)
    , m_start_offset(0)
    , m_limit_offset(size)
    //, m_capacity_offset(size)
    , m_position_offset(0)
{
    m_region.advise(bip::mapped_region::advice_willneed);
}